

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_>::TPZFrontMatrix
          (TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_> *this,void **vtt
          )

{
  TPZAbstractFrontMatrix<float>::TPZAbstractFrontMatrix
            (&this->super_TPZAbstractFrontMatrix<float>,vtt + 1);
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  TPZStackEqnStorage<float>::TPZStackEqnStorage(&this->fStorage);
  TPZFrontNonSym<float>::TPZFrontNonSym(&this->fFront);
  (this->fNumElConnected)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fNumElConnected).fNAlloc = 0;
  (this->fNumElConnected).fStore = (int *)0x0;
  (this->fNumElConnected).fNElements = 0;
  (this->fNumElConnectedBackup)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fNumElConnectedBackup).fStore = (int *)0x0;
  (this->fNumElConnectedBackup).fNElements = 0;
  (this->fNumElConnectedBackup).fNAlloc = 0;
  TPZFrontNonSym<float>::Reset(&this->fFront,0);
  TPZStackEqnStorage<float>::Reset(&this->fStorage);
  TPZVec<int>::Resize(&this->fNumElConnected,0);
  TPZVec<int>::Resize(&this->fNumElConnectedBackup,0);
  this->fLastDecomposed = -1;
  this->fNumEq = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}